

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFFile.cpp
# Opt level: O0

void __thiscall Preferences::PDFFile::render(PDFFile *this,bool shown)

{
  bool bVar1;
  undefined1 uVar2;
  byte in_SIL;
  undefined8 *in_RDI;
  path path;
  string pdfFilePath;
  PDFFile *in_stack_ffffffffffffff48;
  string *this_00;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  void *in_stack_ffffffffffffff70;
  path *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  ImGuiInputTextFlags in_stack_ffffffffffffff84;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  char *in_stack_ffffffffffffff90;
  ImVec2 local_44 [2];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 != 0) {
    if (!render::wasShown) {
      ::PDFFile::operator=
                ((PDFFile *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
    }
    ImGui::Text("PDF file settings");
    std::filesystem::__cxx11::path::string(in_stack_ffffffffffffff78);
    bVar1 = ImGui::InputText(in_stack_ffffffffffffff90,
                             (string *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
                             ,in_stack_ffffffffffffff84,
                             (ImGuiInputTextCallback)in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff70);
    if (bVar1) {
      std::filesystem::__cxx11::path::operator=
                ((path *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 &in_stack_ffffffffffffff78->_M_pathname);
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(local_44,0.0,0.0);
    uVar2 = ImGui::Button((char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (ImVec2 *)in_stack_ffffffffffffff48);
    if ((bool)uVar2) {
      show_file_picker_abi_cxx11_((bool)in_stack_ffffffffffffff8f);
      bVar1 = std::filesystem::__cxx11::path::empty((path *)0x1ccd46);
      if (!bVar1) {
        std::filesystem::__cxx11::path::string(in_stack_ffffffffffffff78);
        this_00 = (string *)&stack0xffffffffffffff70;
        std::__cxx11::string::operator=(local_30,this_00);
        std::__cxx11::string::~string(this_00);
        std::filesystem::__cxx11::path::operator=((path *)*in_RDI,(path *)&stack0xffffffffffffff90);
      }
      std::filesystem::__cxx11::path::~path((path *)CONCAT17(uVar2,in_stack_ffffffffffffff50));
    }
    std::__cxx11::string::~string(local_30);
  }
  render::wasShown = (bool)(local_9 & 1);
  return;
}

Assistant:

void PDFFile::render(bool shown) {
	static bool wasShown = false;

	if (shown) {
		if (!wasShown) { // Panel just got opened
			pdfFileCopy = pdfFile; // Make a copy to be able to restore if cancelled
		}

		ImGui::Text("PDF file settings");

		std::string pdfFilePath = pdfFile.path.string();
		if (ImGui::InputText("PDF File", &pdfFilePath)) {
			pdfFile.path = pdfFilePath;
		}
		ImGui::SameLine();
		if (ImGui::Button("Browse##pdfFilePath")) {
			auto path = show_file_picker();
			if (!path.empty()) {
				pdfFilePath = path.string();
				pdfFile.path = path;
			}
		}
	}

	wasShown = shown;
}